

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O1

void InsertInterval(CostManager *manager,CostInterval *interval_in,float cost,int position,int start
                   ,int end)

{
  float *pfVar1;
  CostInterval *pCVar2;
  CostInterval *pCVar3;
  long lVar4;
  CostInterval **ppCVar5;
  CostManager *pCVar6;
  int iVar7;
  CostInterval *pCVar8;
  
  if (end <= start) {
    return;
  }
  if (499 < manager->count_) {
    pfVar1 = manager->costs_;
    lVar4 = (long)start;
    iVar7 = start - position;
    do {
      iVar7 = iVar7 + 1;
      if (cost < pfVar1[lVar4]) {
        pfVar1[lVar4] = cost;
        manager->dist_array_[lVar4] = (uint16_t)iVar7;
      }
      lVar4 = lVar4 + 1;
    } while (end != lVar4);
    return;
  }
  pCVar3 = manager->free_intervals_;
  if (pCVar3 == (CostInterval *)0x0) {
    pCVar3 = manager->recycled_intervals_;
    if (pCVar3 == (CostInterval *)0x0) {
      pCVar3 = (CostInterval *)WebPSafeMalloc(1,0x20);
      if (pCVar3 == (CostInterval *)0x0) {
        pfVar1 = manager->costs_;
        lVar4 = (long)start;
        iVar7 = start - position;
        do {
          iVar7 = iVar7 + 1;
          if (cost < pfVar1[lVar4]) {
            pfVar1[lVar4] = cost;
            manager->dist_array_[lVar4] = (uint16_t)iVar7;
          }
          lVar4 = lVar4 + 1;
        } while (end != lVar4);
        return;
      }
      goto LAB_0014ea26;
    }
    ppCVar5 = &manager->recycled_intervals_;
  }
  else {
    ppCVar5 = &manager->free_intervals_;
  }
  *ppCVar5 = pCVar3->next_;
LAB_0014ea26:
  pCVar3->cost_ = cost;
  pCVar3->index_ = position;
  pCVar3->start_ = start;
  pCVar3->end_ = end;
  if (interval_in == (CostInterval *)0x0) {
    interval_in = manager->head_;
  }
  for (; (interval_in != (CostInterval *)0x0 && (start < interval_in->start_));
      interval_in = interval_in->previous_) {
  }
  while( true ) {
    pCVar8 = interval_in;
    if (pCVar8 == (CostInterval *)0x0) {
      pCVar2 = manager->head_;
      pCVar3->next_ = pCVar2;
      if (pCVar2 != (CostInterval *)0x0) {
        pCVar2->previous_ = pCVar3;
      }
      goto LAB_0014ea8a;
    }
    interval_in = pCVar8->next_;
    if (interval_in == (CostInterval *)0x0) break;
    if (start <= interval_in->start_) {
      pCVar3->next_ = interval_in;
      if (interval_in != (CostInterval *)0x0) {
        interval_in->previous_ = pCVar3;
      }
LAB_0014ea8a:
      pCVar6 = (CostManager *)&pCVar8->next_;
      if (pCVar8 == (CostInterval *)0x0) {
        pCVar6 = manager;
      }
      pCVar6->head_ = pCVar3;
      pCVar3->previous_ = pCVar8;
      manager->count_ = manager->count_ + 1;
      return;
    }
  }
  pCVar3->next_ = (CostInterval *)0x0;
  goto LAB_0014ea8a;
}

Assistant:

static WEBP_INLINE void InsertInterval(CostManager* const manager,
                                       CostInterval* const interval_in,
                                       float cost, int position, int start,
                                       int end) {
  CostInterval* interval_new;

  if (start >= end) return;
  if (manager->count_ >= COST_CACHE_INTERVAL_SIZE_MAX) {
    // Serialize the interval if we cannot store it.
    UpdateCostPerInterval(manager, start, end, position, cost);
    return;
  }
  if (manager->free_intervals_ != NULL) {
    interval_new = manager->free_intervals_;
    manager->free_intervals_ = interval_new->next_;
  } else if (manager->recycled_intervals_ != NULL) {
    interval_new = manager->recycled_intervals_;
    manager->recycled_intervals_ = interval_new->next_;
  } else {  // malloc for good
    interval_new = (CostInterval*)WebPSafeMalloc(1, sizeof(*interval_new));
    if (interval_new == NULL) {
      // Write down the interval if we cannot create it.
      UpdateCostPerInterval(manager, start, end, position, cost);
      return;
    }
  }

  interval_new->cost_ = cost;
  interval_new->index_ = position;
  interval_new->start_ = start;
  interval_new->end_ = end;
  PositionOrphanInterval(manager, interval_new, interval_in);

  ++manager->count_;
}